

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O0

int shiftcnt(uint32_t x)

{
  int i;
  uint32_t x_local;
  int local_4;
  
  if (x == 0) {
    local_4 = 0;
  }
  else {
    i = 0;
    for (x_local = x; (i < 0x20 && ((x_local & 1) == 0)); x_local = x_local >> 1) {
      i = i + 1;
    }
    local_4 = i;
  }
  return local_4;
}

Assistant:

int shiftcnt(uint32_t x)
/* returns number of 0-bits before the first 1-bit - something like */
/* an integer-log2() function - returns 0 on x=0 */
{
  int i;

  if (x == 0)
    return 0;
  for (i=0; i<32; i++) {
    if (x & 1)
      break;
    x >>= 1;
  }
  return i;
}